

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadLayerOffsetArray
          (CrateReader *this,
          vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *d)

{
  StreamReader *this_00;
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  void *__buf;
  LayerOffset *__nbytes;
  ssize_t sVar4;
  string local_688;
  ostringstream local_668 [8];
  ostringstream ss_e_3;
  string local_4f0;
  ostringstream local_4d0 [8];
  ostringstream ss_e_2;
  string local_358;
  ostringstream local_338 [8];
  ostringstream ss_e_1;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  uint64_t local_28;
  uint64_t n;
  vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *d_local;
  CrateReader *this_local;
  
  local_28 = 0;
  n = (uint64_t)d;
  d_local = (vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *)this;
  bVar1 = StreamReader::read8(this->_sr,&local_28);
  if (bVar1) {
    if ((this->_config).maxArrayElements < local_28) {
      ::std::__cxx11::ostringstream::ostringstream(local_338);
      poVar2 = ::std::operator<<((ostream *)local_338,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadLayerOffsetArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x44a);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_338,"Too many array elements.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_358);
      ::std::__cxx11::string::~string((string *)&local_358);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_338);
    }
    else if (local_28 == 0) {
      this_local._7_1_ = 1;
    }
    else {
      this->_memoryUsage = local_28 * 0x10 + this->_memoryUsage;
      if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
        ::std::__cxx11::ostringstream::ostringstream(local_4d0);
        poVar2 = ::std::operator<<((ostream *)local_4d0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadLayerOffsetArray");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x451);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_4d0,"Reached to max memory budget.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_4f0);
        ::std::__cxx11::string::~string((string *)&local_4f0);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_4d0);
      }
      else {
        ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::resize
                  ((vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *)n,
                   local_28);
        this_00 = this->_sr;
        lVar3 = local_28 << 4;
        __buf = (void *)(local_28 << 4);
        __nbytes = ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::
                   data((vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *)n);
        sVar4 = StreamReader::read(this_00,(int)lVar3,__buf,(size_t)__nbytes);
        if (sVar4 == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_668);
          poVar2 = ::std::operator<<((ostream *)local_668,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReadLayerOffsetArray");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x458);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_668,"Failed to read LayerOffset[] data.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_688);
          ::std::__cxx11::string::~string((string *)&local_688);
          ::std::__cxx11::ostringstream::~ostringstream(local_668);
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadLayerOffsetArray");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x445);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a0,"Failed to read the number of array elements.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadLayerOffsetArray(std::vector<LayerOffset> *d) {
  // array data is not compressed

  uint64_t n{0};
  if (!_sr->read8(&n)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    return false;
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  if (n == 0) {
    return true;
  }

  CHECK_MEMORY_USAGE(size_t(n) * sizeof(LayerOffset));

  d->resize(size_t(n));

  if (!_sr->read(size_t(n) * sizeof(LayerOffset),
                 size_t(n) * sizeof(LayerOffset),
                 reinterpret_cast<uint8_t *>(d->data()))) {
    PUSH_ERROR("Failed to read LayerOffset[] data.");
    return false;
  }

  return true;
}